

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall vm::VM::Taload<double>(VM *this)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  slot_t *psVar4;
  
  ensureStackUsed(this,1);
  iVar2 = this->_sp;
  this->_sp = iVar2 + -1;
  iVar2 = (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl[(long)iVar2 + -1];
  ensureStackUsed(this,1);
  iVar3 = this->_sp;
  this->_sp = iVar3 + -1;
  psVar4 = checkAddr(this,iVar2 * 2 +
                          (this->_stack)._M_t.
                          super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                          super__Head_base<0UL,_int_*,_false>._M_head_impl[(long)iVar3 + -1],2);
  uVar1 = *(undefined8 *)psVar4;
  ensureStackRest(this,2);
  iVar2 = this->_sp;
  *(undefined8 *)
   ((this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl + iVar2) = uVar1;
  this->_sp = iVar2 + 2;
  return;
}

Assistant:

void VM::Taload() {
    addr_t addr = slots_count<T> * POP<addr_t>();
    addr += POP<addr_t>();
    PUSH(READ<T>(addr));
}